

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O1

int pnga_local_iterator_next(_iterator_hdl *hdl,Integer *plo,Integer *phi,char **ptr,Integer *ld)

{
  Integer *pIVar1;
  short sVar2;
  int iVar3;
  long lVar4;
  Integer *pIVar5;
  global_array_t *pgVar6;
  Integer IVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  C_Integer CVar12;
  long lVar13;
  
  lVar9 = hdl->g_a;
  iVar3 = GA[lVar9 + 1000].p_handle;
  IVar7 = pnga_pgroup_nodeid((long)iVar3);
  pgVar6 = GA;
  if (4 < (uint)GA[lVar9 + 1000].distr_type) {
    return 1;
  }
  sVar2 = GA[lVar9 + 1000].ndim;
  lVar13 = (long)(int)sVar2;
  switch(GA[lVar9 + 1000].distr_type) {
  case 0:
    if (0 < hdl->count) {
      return 0;
    }
    pnga_distribution(hdl->g_a,(long)(int)IVar7,plo,phi);
    if (0 < sVar2) {
      lVar9 = 0;
      do {
        if (phi[lVar9] < plo[lVar9]) {
          return 0;
        }
        lVar9 = lVar9 + 1;
      } while (lVar13 != lVar9);
    }
    pnga_access_ptr(hdl->g_a,plo,phi,ptr,ld);
    lVar9 = 1;
    break;
  case 1:
    lVar9 = hdl->count;
    IVar7 = pnga_total_blocks(hdl->g_a);
    if (IVar7 <= lVar9) {
      return 0;
    }
    pnga_distribution(hdl->g_a,hdl->count,plo,phi);
    pnga_access_block_ptr(hdl->g_a,hdl->count,ptr,ld);
    lVar9 = pnga_pgroup_nnodes((long)iVar3);
    break;
  default:
    if (hdl->hibuf[lVar13 + 6] <= hdl->proc_index[lVar13 + 6]) {
      return 0;
    }
    pIVar1 = hdl->index;
    if (0 < sVar2) {
      lVar9 = 0;
      do {
        plo[lVar9] = hdl->blk_size[lVar9] * pIVar1[lVar9] + 1;
        lVar8 = (pIVar1[lVar9] + 1) * hdl->blk_size[lVar9];
        phi[lVar9] = lVar8;
        if (hdl->blk_dim[lVar9] <= lVar8) {
          lVar8 = hdl->blk_dim[lVar9];
        }
        phi[lVar9] = lVar8;
        lVar9 = lVar9 + 1;
      } while (lVar13 != lVar9);
    }
    pnga_access_block_grid_ptr(hdl->g_a,pIVar1,ptr,ld);
    hdl->index[0] = hdl->index[0] + hdl->blk_inc[0];
    if (sVar2 < 1) {
      return 1;
    }
    lVar9 = 0;
    do {
      if ((lVar9 < lVar13 + -1) && (hdl->blk_num[lVar9] <= hdl->index[lVar9])) {
        lVar8 = hdl->blk_inc[lVar9 + 1];
        hdl->index[lVar9] = hdl->proc_index[lVar9];
        hdl->index[lVar9 + 1] = hdl->index[lVar9 + 1] + lVar8;
      }
      lVar9 = lVar9 + 1;
    } while (lVar13 != lVar9);
    return 1;
  case 4:
    lVar8 = hdl->hibuf[lVar13 + 6];
    lVar4 = hdl->proc_index[lVar13 + 6];
    if (lVar8 <= lVar4) {
      return 0;
    }
    pIVar1 = hdl->index;
    if (0 < sVar2) {
      pIVar5 = hdl->mapc;
      lVar10 = 0;
      lVar11 = 0;
      do {
        plo[lVar11] = pIVar5[lVar10 + pIVar1[lVar11]];
        if (pIVar1[lVar11] < hdl->blk_num[lVar11] + -1) {
          CVar12 = pIVar5[lVar10 + pIVar1[lVar11] + 1] + -1;
        }
        else {
          CVar12 = pgVar6[lVar9 + 1000].dims[lVar11];
        }
        phi[lVar11] = CVar12;
        lVar10 = lVar10 + pgVar6[lVar9 + 1000].num_blocks[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar13 != lVar11);
    }
    pnga_access_block_grid_ptr(hdl->g_a,pIVar1,ptr,ld);
    hdl->index[0] = hdl->index[0] + hdl->blk_inc[0];
    if (0 < sVar2) {
      lVar9 = 0;
      do {
        if ((lVar9 < lVar13 + -1) && (hdl->blk_num[lVar9] <= hdl->index[lVar9])) {
          lVar10 = hdl->blk_inc[lVar9 + 1];
          hdl->index[lVar9] = hdl->proc_index[lVar9];
          hdl->index[lVar9 + 1] = hdl->index[lVar9 + 1] + lVar10;
        }
        lVar9 = lVar9 + 1;
      } while (lVar13 != lVar9);
    }
    if (lVar4 < lVar8) {
      return 1;
    }
    return 0;
  }
  hdl->count = hdl->count + lVar9;
  return 1;
}

Assistant:

int pnga_local_iterator_next(_iterator_hdl *hdl, Integer plo[],
    Integer phi[], char **ptr, Integer ld[])
{
  Integer i;
  Integer handle = GA_OFFSET + hdl->g_a;
  Integer grp = GA[handle].p_handle;
  Integer elemsize = GA[handle].elemsize;
  int ndim;
  int me = pnga_pgroup_nodeid(grp);
  ndim = GA[handle].ndim;
  if (GA[handle].distr_type == REGULAR) {
    Integer nelems;
    /* no blocks left, so return */
    if (hdl->count>0) return 0;

    /* Find  visible portion of patch held by this processor and
     * return the result in plo and phi. Return pointer to local
     * data as well
     */
    pnga_distribution(hdl->g_a, me, plo, phi);
    /* Check to see if this process has any data. Return 0 if
     * it does not */
    for (i=0; i<ndim; i++) {
      if (phi[i]<plo[i]) return 0;
    }
    pnga_access_ptr(hdl->g_a,plo,phi,ptr,ld);
    hdl->count++;
  } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
    /* Simple block-cyclic distribution */
    if (hdl->count >= pnga_total_blocks(hdl->g_a)) return 0;
    pnga_distribution(hdl->g_a,hdl->count,plo,phi);
    pnga_access_block_ptr(hdl->g_a,hdl->count,ptr,ld);
    hdl->count += pnga_pgroup_nnodes(grp);
  } else if (GA[handle].distr_type == SCALAPACK ||
      GA[handle].distr_type == TILED) {
    /* Scalapack-type data distribution */
    if (hdl->index[ndim-1] >= hdl->blk_num[ndim-1]) return 0;
    /* Find coordinates of bounding block */
    for (i=0; i<ndim; i++) {
      plo[i] = hdl->index[i]*hdl->blk_size[i]+1;
      phi[i] = (hdl->index[i]+1)*hdl->blk_size[i];
      if (phi[i] > hdl->blk_dim[i]) phi[i] = hdl->blk_dim[i];
    }
    pnga_access_block_grid_ptr(hdl->g_a,hdl->index,ptr,ld);
    hdl->index[0] += hdl->blk_inc[0];
    for (i=0; i<ndim; i++) {
      if (hdl->index[i] >= hdl->blk_num[i] && i<ndim-1) {
        hdl->index[i] = hdl->proc_index[i];
        hdl->index[i+1] += hdl->blk_inc[i+1];
      }
    }
  } else if (GA[handle].distr_type == TILED_IRREG) {
    /* Irregular tiled data distribution */
    Integer offset = 0;
    if (hdl->index[ndim-1] >= hdl->blk_num[ndim-1]) return 0;
    /* Find coordinates of bounding block */
    for (i=0; i<ndim; i++) {
      plo[i] = hdl->mapc[offset+hdl->index[i]];
      if (hdl->index[i] < hdl->blk_num[i]-1) {
        phi[i] = hdl->mapc[offset+hdl->index[i]+1]-1;
      } else {
        phi[i] = GA[handle].dims[i];
      }
      offset += GA[handle].num_blocks[i];
    }
    pnga_access_block_grid_ptr(hdl->g_a,hdl->index,ptr,ld);
    hdl->index[0] += hdl->blk_inc[0];
    for (i=0; i<ndim; i++) {
      if (hdl->index[i] >= hdl->blk_num[i] && i<ndim-1) {
        hdl->index[i] = hdl->proc_index[i];
        hdl->index[i+1] += hdl->blk_inc[i+1];
      }
    }
  }
  return 1;
}